

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

size_t jessilib::find<char32_t,char,false>
                 (basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string,
                 basic_string_view<char,_std::char_traits<char>_> in_substring)

{
  wchar32 wVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  jessilib *pjVar5;
  jessilib *pjVar6;
  jessilib *extraout_RDX;
  jessilib *pjVar7;
  char *pcVar8;
  jessilib *this;
  jessilib *pjVar9;
  jessilib *this_00;
  decode_result dVar10;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_01;
  char32_t *local_58;
  
  in_string_00._M_len = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  pjVar5 = (jessilib *)in_substring._M_len;
  if (pjVar5 == (jessilib *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = 0xffffffffffffffff;
    if (this != (jessilib *)0x0) {
      if (pjVar5 == (jessilib *)0x1) {
        in_string_00._M_str._0_4_ = (int)*in_substring._M_str;
        in_string_00._M_str._4_4_ = 0;
        sVar4 = find<char32_t,false>(this,in_string_00,(char32_t)in_substring._M_str);
        return sVar4;
      }
      sVar4 = 0;
      local_58 = in_string_00._M_len;
      do {
        pjVar9 = (jessilib *)0x0;
        pjVar7 = pjVar5;
        pcVar8 = in_substring._M_str;
        this_00 = pjVar5;
        do {
          wVar1 = local_58[(long)pjVar9];
          in_string_01._M_str = (char *)pjVar7;
          in_string_01._M_len = (size_t)pcVar8;
          dVar10 = decode_codepoint_utf8<char>(this_00,in_string_01);
          pjVar6 = (jessilib *)dVar10.units;
          if (pjVar6 == (jessilib *)0x0) goto LAB_002c39f8;
          pjVar7 = pjVar6;
          if (wVar1 != dVar10.codepoint) {
            iVar2 = jessilib::fold(wVar1);
            iVar3 = jessilib::fold(dVar10.codepoint);
            pjVar7 = extraout_RDX;
            if (iVar2 != iVar3) break;
          }
          this_00 = this_00 + -(long)pjVar6;
          if (this_00 == (jessilib *)0x0) {
            return sVar4;
          }
          pcVar8 = pcVar8 + (long)pjVar6;
          pjVar9 = pjVar9 + 1;
        } while (this != pjVar9);
        local_58 = local_58 + 1;
        sVar4 = sVar4 + 1;
        this = this + -1;
      } while (this != (jessilib *)0x0);
LAB_002c39f8:
      sVar4 = 0xffffffffffffffff;
    }
  }
  return sVar4;
}

Assistant:

size_t find(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_substring) {
	// If we're searching for nothing, then we've found it at the front
	if (in_substring.empty()) {
		return 0;
	}

	// If we don't have anything to search through, there's nothing to be found
	if (in_string.empty()) {
		return decltype(in_string)::npos;
	}

	// TODO: expand this to cover any instance where in_substring is a single codepoint, rather than a single data unit
	if (in_substring.size() == 1) {
		return find<LhsCharT, CaseSensitive>(in_string, in_substring[0]);
	}

	// TODO: optimize for when in_substring is small and of different type, by only decoding it once

	size_t codepoints_removed{};
	while (!in_string.empty()) {
		// If in_string and in_prefix are the same type, compare their sizes and quickly return if in_string is too small
		if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
			if (in_string.size() < in_substring.size()) {
				return decltype(in_string)::npos;
			}
		}

		std::basic_string_view<LhsCharT> string = in_string;
		std::basic_string_view<RhsCharT> substring = in_substring;
		decode_result string_front;
		do {
			// TODO: optimize this for when in_string and in_substring are same type, by only decoding in_string, solely
			// to determine number of data units to compare
			string_front = decode_codepoint(string);
			decode_result prefix_front = decode_codepoint(substring);

			if (string_front.units == 0
				|| prefix_front.units == 0) {
				// Failed to decode front codepoint; bad unicode sequence
				return decltype(in_string)::npos;
			}

			if constexpr (CaseSensitive) {
				if (string_front.codepoint != prefix_front.codepoint) {
					// Codepoints aren't the same; break & try next position
					break;
				}
			}
			else {
				if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
					// Codepoints don't fold the same; break & try next position
					break;
				}
			}

			// Codepoints are equal; trim off the fronts and continue
			string.remove_prefix(string_front.units);
			substring.remove_prefix(prefix_front.units);

			if (substring.empty()) {
				// We found the substring! We can return our current position
				return codepoints_removed;
			}
		} while (!string.empty());

		// Didn't find a match here; remove the front codepoint and try the next position
		in_string.remove_prefix(string_front.units);
		codepoints_removed += string_front.units;
	}

	// We reached the end of in_string before finding the prefix :(
	return decltype(in_string)::npos;
}